

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O2

void __thiscall crnlib::qdxt1::optimize_selectors_task(qdxt1 *this,uint64 data,void *pData_ptr)

{
  dxt_pixel_block *pdVar1;
  byte bVar2;
  color_quad_u8 *pcVar3;
  bool bVar4;
  uint uVar5;
  crn_thread_id_t cVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long *plVar14;
  uint64 total_error;
  ulong uVar15;
  ulong uVar16;
  uint x;
  ulong uVar17;
  long lVar18;
  dxt1_block blk;
  uint block_index;
  vector<unsigned_int> block_categories [2];
  int local_68;
  
  block_categories[1].m_p = (uint *)0x0;
  block_categories[1].m_size = 0;
  block_categories[1].m_capacity = 0;
  block_categories[0].m_p = (uint *)0x0;
  block_categories[0].m_size = 0;
  block_categories[0].m_capacity = 0;
  vector<unsigned_int>::reserve(block_categories,0x800);
  vector<unsigned_int>::reserve(block_categories + 1,0x800);
  uVar16 = 0;
  do {
    if (((*(uint *)(*pData_ptr + 8) <= uVar16) || (this->m_canceled != false)) ||
       (((char)uVar16 == '\0' &&
        ((cVar6 = crn_get_current_thread_id(), cVar6 == this->m_main_thread_id &&
         (bVar4 = update_progress(this,(uint)uVar16,*(int *)(*pData_ptr + 8) - 1), !bVar4)))))) {
      lVar11 = 0x10;
      do {
        vector<unsigned_int>::~vector
                  ((vector<unsigned_int> *)((long)&block_categories[0].m_p + lVar11));
        lVar11 = lVar11 + -0x10;
      } while (lVar11 != -0x10);
      return;
    }
    uVar5 = this->m_pTask_pool->m_num_threads;
    if ((uVar5 == 0) ||
       (local_68 = (int)data, (int)((uVar16 & 0xffffffff) % (ulong)(uVar5 + 1)) == local_68)) {
      lVar11 = **pData_ptr;
      if (1 < *(uint *)(lVar11 + 8 + uVar16 * 0x10)) {
        vector<unsigned_int>::resize(block_categories,0,false);
        vector<unsigned_int>::resize(block_categories + 1,0,false);
        plVar14 = (long *)(lVar11 + uVar16 * 0x10);
        for (uVar17 = 0; uVar17 < *(uint *)(plVar14 + 1); uVar17 = uVar17 + 1) {
          block_index = *(uint *)(*plVar14 + uVar17 * 4);
          uVar10 = this->m_elements_per_block * block_index;
          if (*(ushort *)this->m_pDst_elements[uVar10].m_high_color <
              *(ushort *)this->m_pDst_elements[uVar10].m_low_color) {
            vector<unsigned_int>::push_back(block_categories,&block_index);
          }
          else {
            uVar10 = (this->m_params).m_dxt1a_alpha_threshold;
            if (uVar10 == 0) {
LAB_0012aa0b:
              vector<unsigned_int>::push_back(block_categories + 1,&block_index);
            }
            else {
              lVar11 = 0;
              do {
                if (lVar11 == 0x10) goto LAB_0012aa0b;
                pcVar3 = this->m_pBlocks[block_index].m_pixels[0] + lVar11;
                lVar11 = lVar11 + 1;
              } while (uVar10 <= (pcVar3->field_0).field_0.a);
            }
          }
        }
        blk.m_low_color[0] = '\0';
        blk.m_low_color[1] = '\0';
        blk.m_high_color[0] = '\0';
        blk.m_high_color[1] = '\0';
        blk.m_selectors[0] = '\0';
        blk.m_selectors[1] = '\0';
        blk.m_selectors[2] = '\0';
        blk.m_selectors[3] = '\0';
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          uVar10 = block_categories[lVar11].m_size;
          if (1 < uVar10) {
            for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
              for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
                uVar17 = 0;
                uVar8 = 0xffffffffff;
                for (uVar13 = 0; uVar13 != (ulong)(lVar11 != 1) + 3; uVar13 = uVar13 + 1) {
                  uVar15 = 0;
                  for (uVar12 = 0; uVar12 < uVar10; uVar12 = uVar12 + 1) {
                    uVar10 = block_categories[lVar11].m_p[uVar12];
                    pdVar1 = this->m_pBlocks;
                    uVar7 = this->m_elements_per_block * uVar10;
                    dxt1_block::get_block_colors
                              ((color_quad_u8 *)&block_index,
                               *(uint16 *)this->m_pDst_elements[uVar7].m_low_color,
                               *(uint16 *)this->m_pDst_elements[uVar7].m_high_color);
                    uVar5 = crnlib::color::color_distance
                                      ((this->m_params).m_perceptual,
                                       pdVar1[uVar10].m_pixels[lVar9] + lVar18,
                                       (color_quad_u8 *)(&block_index + uVar13),false);
                    uVar15 = uVar15 + uVar5;
                    uVar10 = block_categories[lVar11].m_size;
                  }
                  if (uVar15 < uVar8) {
                    uVar17 = uVar13 & 0xffffffff;
                    uVar8 = uVar15;
                  }
                }
                bVar2 = (char)lVar18 * '\x02';
                blk.m_selectors[lVar9] =
                     (byte)((int)uVar17 << (bVar2 & 0x1f)) |
                     ~(byte)(3 << (bVar2 & 0x1f)) & blk.m_selectors[lVar9];
              }
            }
            for (uVar17 = 0; uVar17 < uVar10; uVar17 = uVar17 + 1) {
              *&this->m_pDst_elements
                [this->m_elements_per_block * block_categories[lVar11].m_p[uVar17]].m_selectors =
                   blk.m_selectors;
              uVar10 = block_categories[lVar11].m_size;
            }
          }
        }
      }
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void qdxt1::optimize_selectors_task(uint64 data, void* pData_ptr)
    {
        const uint thread_index = static_cast<uint>(data);

        optimize_selectors_params& task_params = *static_cast<optimize_selectors_params*>(pData_ptr);

        crnlib::vector<uint> block_categories[2];
        block_categories[0].reserve(2048);
        block_categories[1].reserve(2048);

        for (uint cluster_index = 0; cluster_index < task_params.m_selector_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & 255) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, task_params.m_selector_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& selector_indices = task_params.m_selector_cluster_indices[cluster_index];

            if (selector_indices.size() <= 1)
            {
                continue;
            }

            block_categories[0].resize(0);
            block_categories[1].resize(0);

            for (uint block_iter = 0; block_iter < selector_indices.size(); block_iter++)
            {
                const uint block_index = selector_indices[block_iter];

                const dxt1_block& src_block = get_block(block_index);

                if (!src_block.is_alpha_block())
                {
                    block_categories[0].push_back(block_index);
                }
                else
                {
                    bool has_alpha_pixels = false;

                    if (m_params.m_dxt1a_alpha_threshold > 0)
                    {
                        const color_quad_u8* pSrc_pixels = (const color_quad_u8*)m_pBlocks[block_index].m_pixels;

                        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                        {
                            const color_quad_u8& src = pSrc_pixels[i];
                            if (src.a < m_params.m_dxt1a_alpha_threshold)
                            {
                                has_alpha_pixels = true;
                                break;
                            }
                        }
                    }

                    if (has_alpha_pixels)
                    {
                        continue;
                    }

                    block_categories[1].push_back(block_index);
                }
            }

            dxt1_block blk;
            utils::zero_object(blk);

            for (uint block_type = 0; block_type <= 1; block_type++)
            {
                const crnlib::vector<uint>& block_indices = block_categories[block_type];
                if (block_indices.size() <= 1)
                {
                    continue;
                }

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        uint best_s = 0;
                        uint64 best_error = 0xFFFFFFFFFFULL;

                        uint max_s = 4;
                        if (block_type == 1)
                        {
                            max_s = 3;
                        }

                        for (uint s = 0; s < max_s; s++)
                        {
                            uint64 total_error = 0;

                            for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                            {
                                const uint block_index = block_indices[block_iter];

                                const color_quad_u8& orig_color = m_pBlocks[block_index].m_pixels[y][x];

                                const dxt1_block& dst_block = get_block(block_index);

                                color_quad_u8 colors[4];
                                dxt1_block::get_block_colors(colors, static_cast<uint16>(dst_block.get_low_color()), static_cast<uint16>(dst_block.get_high_color()));

                                uint error = color::color_distance(m_params.m_perceptual, orig_color, colors[s], false);

                                total_error += error;
                            }

                            if (total_error < best_error)
                            {
                                best_error = total_error;
                                best_s = s;
                            }
                        }

                        blk.set_selector(x, y, best_s);

                    } // x
                } // y

                for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                {
                    const uint block_index = block_indices[block_iter];

                    dxt1_block& dst_block = get_block(block_index);

                    memcpy(dst_block.m_selectors, blk.m_selectors, sizeof(dst_block.m_selectors));
                }
            }

        } // cluster_index
    }